

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

void * HUF_alignUpWorkspace(void *workspace,size_t *workspaceSizePtr,size_t align)

{
  ulong uVar1;
  ulong uVar2;
  BYTE *aligned;
  size_t add;
  size_t rem;
  size_t mask;
  size_t align_local;
  size_t *workspaceSizePtr_local;
  void *workspace_local;
  
  uVar1 = align - 1;
  uVar2 = align - ((ulong)workspace & uVar1) & uVar1;
  workspace_local = (void *)((long)workspace + uVar2);
  if ((align & align - 1) != 0) {
    __assert_fail("(align & (align - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x76,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
  }
  if (8 < align) {
    __assert_fail("align <= HUF_WORKSPACE_MAX_ALIGNMENT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x77,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
  }
  if (*workspaceSizePtr < uVar2) {
    *workspaceSizePtr = 0;
    workspace_local = (void *)0x0;
  }
  else {
    if (align <= uVar2) {
      __assert_fail("add < align",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x79,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
    }
    if (((ulong)workspace_local & uVar1) != 0) {
      __assert_fail("((size_t)aligned & mask) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x7a,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
    }
    *workspaceSizePtr = *workspaceSizePtr - uVar2;
  }
  return workspace_local;
}

Assistant:

static void* HUF_alignUpWorkspace(void* workspace, size_t* workspaceSizePtr, size_t align)
{
    size_t const mask = align - 1;
    size_t const rem = (size_t)workspace & mask;
    size_t const add = (align - rem) & mask;
    BYTE* const aligned = (BYTE*)workspace + add;
    assert((align & (align - 1)) == 0); /* pow 2 */
    assert(align <= HUF_WORKSPACE_MAX_ALIGNMENT);
    if (*workspaceSizePtr >= add) {
        assert(add < align);
        assert(((size_t)aligned & mask) == 0);
        *workspaceSizePtr -= add;
        return aligned;
    } else {
        *workspaceSizePtr = 0;
        return NULL;
    }
}